

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O1

double icu_63::double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  sbyte sVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  Double *pDVar13;
  Double *this;
  byte bVar14;
  ulong uVar15;
  byte *pbVar16;
  bool bVar17;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  pcVar5 = *current;
  while (*pcVar5 == '0') {
    pcVar5 = pcVar5 + 1;
    *current = pcVar5;
    if (pcVar5 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar9 = 0x18;
  if (read_as_double) {
    sVar9 = 0x35;
  }
  pbVar16 = (byte *)*current;
  uVar15 = 0;
  this = (Double *)0x0;
  do {
    bVar10 = *pbVar16;
    lVar6 = (long)(int)(char)bVar10;
    if ((int)(char)bVar10 - 0x30U < 10) {
      lVar6 = lVar6 + -0x30;
LAB_00261bc4:
      pDVar13 = (Double *)((long)this * 0x10 + lVar6);
      uVar7 = (long)pDVar13 >> sVar9;
      if ((int)uVar7 != 0) {
        uVar15 = 1;
        if (1 < (int)uVar7) {
          uVar11 = uVar7 & 0xffffffff;
          do {
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar11 = uVar11 >> 1;
            uVar4 = (uint)uVar7;
            uVar7 = uVar11;
          } while (3 < uVar4);
        }
        bVar10 = (byte)uVar15;
        this = (Double *)((long)pDVar13 >> (bVar10 & 0x3f));
        pbVar16 = pbVar16 + 1;
        *current = (char *)pbVar16;
        bVar14 = 1;
        while ((pbVar16 != (byte *)end &&
               ((bVar1 = *pbVar16, (char)bVar1 < 0x40 && (int)(char)bVar1 - 0x30U < 10 ||
                ((uVar4 = bVar1 - 0x41, uVar4 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0))))))) {
          bVar14 = bVar14 & bVar1 == 0x30;
          uVar15 = (ulong)((int)uVar15 + 4);
          pbVar16 = pbVar16 + 1;
          *current = (char *)pbVar16;
        }
        if (!allow_trailing_junk) {
          bVar17 = pbVar16 != (byte *)end;
          if ((bVar17) && (bVar2 = isWhitespace((int)(char)*pbVar16), bVar2)) {
            do {
              pbVar16 = pbVar16 + 1;
              *current = (char *)pbVar16;
              bVar17 = pbVar16 != (byte *)end;
              if (pbVar16 == (byte *)end) break;
              bVar2 = isWhitespace((int)(char)*pbVar16);
            } while (bVar2);
          }
          iVar3 = 1;
          if (bVar17) goto LAB_00261de9;
        }
        uVar12 = (uint)pDVar13 & ~(-1 << (bVar10 & 0x1f));
        uVar4 = 1 << (bVar10 - 1 & 0x1f);
        if ((int)uVar4 < (int)uVar12) {
          this = (Double *)((long)&this->d64_ + 1);
        }
        else if (uVar12 == uVar4) {
          this = (Double *)((long)&this->d64_ + (ulong)((byte)(~bVar14 | (byte)this) & 1));
        }
        bVar17 = (1L << sVar9 & (ulong)this) != 0;
        this = (Double *)((long)this >> bVar17);
        uVar15 = (ulong)((int)uVar15 + (uint)bVar17);
        goto LAB_00261de4;
      }
      pbVar16 = pbVar16 + 1;
      *current = (char *)pbVar16;
      iVar3 = 0;
      this = pDVar13;
    }
    else {
      if ((byte)(bVar10 + 0x9f) < 6) {
        lVar6 = lVar6 + -0x57;
        goto LAB_00261bc4;
      }
      if ((byte)(bVar10 + 0xbf) < 6) {
        lVar6 = lVar6 + -0x37;
        goto LAB_00261bc4;
      }
      iVar3 = 4;
      if (allow_trailing_junk) goto LAB_00261de9;
      bVar17 = pbVar16 != (byte *)end;
      if ((bVar17) && (bVar2 = isWhitespace((int)(char)*pbVar16), bVar2)) {
        do {
          pbVar16 = pbVar16 + 1;
          *current = (char *)pbVar16;
          bVar17 = pbVar16 != (byte *)end;
          if (pbVar16 == (byte *)end) break;
          bVar2 = isWhitespace((int)(char)*pbVar16);
        } while (bVar2);
      }
      if (bVar17) {
        iVar3 = 1;
        goto LAB_00261de9;
      }
LAB_00261de4:
      iVar3 = 4;
    }
LAB_00261de9:
    if (iVar3 != 0) {
      if (iVar3 != 4) {
        return junk_string_value;
      }
      goto LAB_00261e24;
    }
    if (pbVar16 == (byte *)end) {
LAB_00261e24:
      *result_is_junk = false;
      if ((int)uVar15 != 0) {
        diy_fp._8_8_ = this;
        diy_fp.f_ = uVar15;
        dVar8 = (double)Double::DiyFpToUint64(this,diy_fp);
        return dVar8;
      }
      if (sign) {
        if (this == (Double *)0x0) {
          return -0.0;
        }
        this = (Double *)-(long)this;
      }
      return (double)(long)this;
    }
  } while( true );
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}